

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
ConfigurationTestNode::Evaluate
          (string *__return_storage_ptr__,ConfigurationTestNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  cmValue *this_00;
  pointer *suffix_00;
  GeneratorExpressionContent *context_00;
  cmGeneratorExpressionContext *pcVar1;
  bool bVar2;
  int iVar3;
  const_reference s;
  ulong uVar4;
  char *lhs;
  char *rhs;
  string *s_00;
  allocator<char> local_221;
  int local_220;
  allocator<char> local_219;
  string local_218;
  reference local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  string_view local_1b8;
  cmValue local_1a8;
  cmValue mapValue;
  cmAlphaNum local_180;
  cmAlphaNum local_150;
  undefined1 local_120 [8];
  string mapProp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  string suffix;
  cmValue imp;
  cmValue loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_88;
  string local_68;
  cmGeneratorExpressionDAGChecker *local_38;
  cmGeneratorExpressionDAGChecker *param_5_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  ConfigurationTestNode *this_local;
  
  local_38 = param_4;
  param_5_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (ConfigurationTestNode *)__return_storage_ptr__;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(parameters);
  if (bVar2) {
    ConfigurationNode::Evaluate
              (__return_storage_ptr__,&configurationNode,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)context_local,(cmGeneratorExpressionContext *)content_local,
               (GeneratorExpressionContent *)param_5_local,(cmGeneratorExpressionDAGChecker *)0x0);
    return __return_storage_ptr__;
  }
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::configValidator == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::configValidator), iVar3 != 0)) {
    cmsys::RegularExpression::RegularExpression(&Evaluate::configValidator,"^[A-Za-z0-9_]*$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::configValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::configValidator);
  }
  s = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context_local);
  bVar2 = cmsys::RegularExpression::find(&Evaluate::configValidator,s);
  pcVar1 = context_local;
  context_00 = content_local;
  if (!bVar2) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_68,(GeneratorExpressionContent *)param_5_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Expression syntax not recognized.",
               (allocator<char> *)((long)&__range1 + 7));
    reportError((cmGeneratorExpressionContext *)context_00,&local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  *(undefined1 *)((long)&content_local[4].StartContent + 2) = 1;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)context_local);
  param = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pcVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&param);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&__end1);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      lhs = (char *)std::__cxx11::string::c_str();
      rhs = (char *)std::__cxx11::string::c_str();
      iVar3 = cmsysString_strcasecmp(lhs,rhs);
      if (iVar3 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"1",(allocator<char> *)((long)&loc.Value + 6));
        std::allocator<char>::~allocator((allocator<char> *)((long)&loc.Value + 6));
        return __return_storage_ptr__;
      }
    }
    else {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"1",(allocator<char> *)((long)&loc.Value + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&loc.Value + 7));
        return __return_storage_ptr__;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  if (content_local[4].ParamChildren.
      super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) goto LAB_008566af;
  bVar2 = cmGeneratorTarget::IsImported
                    ((cmGeneratorTarget *)
                     content_local[4].ParamChildren.
                     super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar2) goto LAB_008566af;
  cmValue::cmValue(&imp,(nullptr_t)0x0);
  this_00 = (cmValue *)((long)&suffix.field_2 + 8);
  cmValue::cmValue(this_00,(nullptr_t)0x0);
  suffix_00 = &mappedConfigs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)suffix_00);
  bVar2 = cmTarget::GetMappedConfig
                    ((cmTarget *)
                     ((content_local[4].ParamChildren.
                       super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                     super__Vector_base<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (string *)
                     &content_local[3].ParamChildren.
                      super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&imp,this_00,
                     (string *)suffix_00);
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&mapProp.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_150,"MAP_IMPORTED_CONFIG_");
    cmsys::SystemTools::UpperCase
              ((string *)&mapValue,
               (string *)
               &content_local[3].ParamChildren.
                super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmAlphaNum::cmAlphaNum(&local_180,(string *)&mapValue);
    cmStrCat<>((string *)local_120,&local_150,&local_180);
    std::__cxx11::string::~string((string *)&mapValue);
    local_1a8 = cmGeneratorTarget::GetProperty
                          ((cmGeneratorTarget *)
                           content_local[4].ParamChildren.
                           super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_120);
    bVar2 = cmValue::operator_cast_to_bool(&local_1a8);
    if (bVar2) {
      s_00 = cmValue::operator*[abi_cxx11_(&local_1a8);
      cmsys::SystemTools::UpperCase((string *)&__range4,s_00);
      local_1b8 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&__range4);
      cmExpandList(local_1b8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&mapProp.field_2 + 8),false);
      std::__cxx11::string::~string((string *)&__range4);
      pcVar1 = context_local;
      __end4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)context_local);
      local_1f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)pcVar1);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_1f0);
        if (!bVar2) break;
        local_1f8 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end4);
        cmsys::SystemTools::UpperCase(&local_218,local_1f8);
        bVar2 = ::cm::
                contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&mapProp.field_2 + 8),&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__return_storage_ptr__,"1",&local_219);
          std::allocator<char>::~allocator(&local_219);
          local_220 = 1;
          goto LAB_0085663b;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end4);
      }
    }
    local_220 = 0;
LAB_0085663b:
    std::__cxx11::string::~string((string *)local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&mapProp.field_2 + 8));
    if (local_220 == 0) goto LAB_0085667b;
  }
  else {
LAB_0085667b:
    local_220 = 0;
  }
  std::__cxx11::string::~string
            ((string *)
             &mappedConfigs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_220 != 0) {
    return __return_storage_ptr__;
  }
LAB_008566af:
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"0",&local_221);
  std::allocator<char>::~allocator(&local_221);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    if (parameters.empty()) {
      return configurationNode.Evaluate(parameters, context, content, nullptr);
    }
    static cmsys::RegularExpression configValidator("^[A-Za-z0-9_]*$");
    if (!configValidator.find(parameters.front())) {
      reportError(context, content->GetOriginalExpression(),
                  "Expression syntax not recognized.");
      return std::string();
    }
    context->HadContextSensitiveCondition = true;
    for (auto const& param : parameters) {
      if (context->Config.empty()) {
        if (param.empty()) {
          return "1";
        }
      } else if (cmsysString_strcasecmp(param.c_str(),
                                        context->Config.c_str()) == 0) {
        return "1";
      }
    }

    if (context->CurrentTarget && context->CurrentTarget->IsImported()) {
      cmValue loc = nullptr;
      cmValue imp = nullptr;
      std::string suffix;
      if (context->CurrentTarget->Target->GetMappedConfig(context->Config, loc,
                                                          imp, suffix)) {
        // This imported target has an appropriate location
        // for this (possibly mapped) config.
        // Check if there is a proper config mapping for the tested config.
        std::vector<std::string> mappedConfigs;
        std::string mapProp = cmStrCat(
          "MAP_IMPORTED_CONFIG_", cmSystemTools::UpperCase(context->Config));
        if (cmValue mapValue = context->CurrentTarget->GetProperty(mapProp)) {
          cmExpandList(cmSystemTools::UpperCase(*mapValue), mappedConfigs);

          for (auto const& param : parameters) {
            if (cm::contains(mappedConfigs, cmSystemTools::UpperCase(param))) {
              return "1";
            }
          }
        }
      }
    }
    return "0";
  }